

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

int64_t msa_nlzc_df(uint32_t df,int64_t arg)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = 1L << ((char)df + 3U & 0x3f);
  uVar4 = uVar2 >> 1;
  uVar5 = (ulong)(arg << (-(char)uVar2 & 0x3fU)) >> (-(char)uVar2 & 0x3fU);
  uVar8 = uVar4 & 0xffffffff;
  do {
    uVar6 = uVar5 >> ((byte)uVar4 & 0x3f);
    uVar7 = uVar6;
    if (uVar6 == 0) {
      uVar7 = uVar5;
    }
    uVar3 = (uint)uVar4;
    uVar1 = uVar3;
    if (uVar6 == 0) {
      uVar1 = 0;
    }
    uVar1 = (int)uVar2 - uVar1;
    uVar2 = (ulong)uVar1;
    uVar4 = uVar8 >> 1;
    uVar5 = uVar7;
    uVar8 = uVar4;
  } while (1 < uVar3);
  return (long)(int)uVar1 - uVar7;
}

Assistant:

static inline int64_t msa_nlzc_df(uint32_t df, int64_t arg)
{
    uint64_t x, y;
    int n, c;

    x = UNSIGNED(arg, df);
    n = DF_BITS(df);
    c = DF_BITS(df) / 2;

    do {
        y = x >> c;
        if (y != 0) {
            n = n - c;
            x = y;
        }
        c = c >> 1;
    } while (c != 0);

    return n - x;
}